

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

double dlib::string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  byte bVar1;
  int iVar2;
  int_type iVar3;
  undefined8 uVar4;
  string *in_RDI;
  double temp;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> sin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  undefined1 uVar5;
  string_cast_error *in_stack_fffffffffffffe40;
  double local_190;
  long local_188 [49];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_188,in_RDI,_S_in);
  std::istream::operator>>((istringstream *)local_188,&local_190);
  bVar1 = std::ios::operator!((ios *)((long)local_188 + *(long *)(local_188[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    uVar5 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    narrow<char,std::char_traits<char>,std::allocator<char>>(in_stack_fffffffffffffdd8);
    string_cast_error::string_cast_error
              (in_stack_fffffffffffffe40,(string *)CONCAT17(uVar5,in_stack_fffffffffffffe38));
    __cxa_throw(uVar4,&string_cast_error::typeinfo,string_cast_error::~string_cast_error);
  }
  iVar2 = std::istream::get();
  iVar3 = std::char_traits<char>::eof();
  if (iVar2 != iVar3) {
    uVar4 = __cxa_allocate_exception(0x30);
    narrow<char,std::char_traits<char>,std::allocator<char>>(in_stack_fffffffffffffdd8);
    string_cast_error::string_cast_error
              (in_stack_fffffffffffffe40,
               (string *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    __cxa_throw(uVar4,&string_cast_error::typeinfo,string_cast_error::~string_cast_error);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_188);
  return local_190;
}

Assistant:

static const T cast (
            const std::basic_string<charT,traits,alloc>& str
        )
        {
            using namespace std;
            basic_istringstream<charT,traits,alloc> sin(str);
            T temp;
            sin >> temp;
            if (!sin) throw string_cast_error(narrow(str));
            if (sin.get() != std::char_traits<charT>::eof()) throw string_cast_error(narrow(str));   
            return temp;
        }